

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

void __thiscall
CTcParser::insert_propset_expansion(CTcParser *this,propset_def *propset_stack,int propset_depth)

{
  long *plVar1;
  tc_toktyp_t tVar2;
  bool bVar3;
  propset_token_source *this_00;
  ulong uVar4;
  propset_tok **pppVar5;
  ulong uVar6;
  CTcToken *pCVar7;
  long lVar8;
  propset_tok *ppVar9;
  bool bVar10;
  
  uVar6 = 0;
  if (0 < propset_depth) {
    uVar6 = (ulong)(uint)propset_depth;
  }
  lVar8 = 0;
  do {
    if (uVar6 * 0x18 + 0x18 == lVar8 + 0x18) {
      return;
    }
    plVar1 = (long *)((long)&propset_stack->param_tok_head + lVar8);
    lVar8 = lVar8 + 0x18;
  } while (*plVar1 == 0);
  this_00 = (propset_token_source *)CTcPrsMem::alloc(G_prsmem,0x48);
  (this_00->super_CTcTokenSource)._vptr_CTcTokenSource = (_func_int **)&PTR__CTcTokenSource_0034fc90
  ;
  this_00->nxt_tok = (propset_tok *)0x0;
  this_00->last_tok = (propset_tok *)0x0;
  propset_token_source::insert_token(this_00,TOKT_LPAR,"(",1);
  bVar3 = false;
  for (uVar4 = 0; uVar4 != uVar6; uVar4 = uVar4 + 1) {
    for (pCVar7 = (CTcToken *)&propset_stack[uVar4].param_tok_head; pCVar7 = *(CTcToken **)pCVar7,
        pCVar7 != (CTcToken *)0x0; pCVar7 = pCVar7 + 1) {
      if (bVar3) {
        propset_token_source::insert_token(this_00,TOKT_COMMA,",",1);
      }
      if (pCVar7->typ_ == TOKT_COMMA) {
        if ((*(int **)(pCVar7 + 1) != (int *)0x0) && (**(int **)(pCVar7 + 1) == 0x20)) {
          bVar3 = true;
          break;
        }
      }
      else if (pCVar7->typ_ == TOKT_TIMES) {
        bVar3 = false;
        break;
      }
      propset_token_source::insert_token(this_00,pCVar7);
      bVar3 = false;
    }
  }
  if ((G_tok->curtok_).typ_ == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
    bVar10 = bVar3;
    if (((G_tok->curtok_).typ_ != TOKT_RPAR) && (bVar10 = true, bVar3)) {
      propset_token_source::insert_token(this_00,TOKT_COMMA,",",1);
    }
    while (bVar3 = bVar10, tVar2 = (G_tok->curtok_).typ_, tVar2 != TOKT_EOF) {
      if (tVar2 == TOKT_RPAR) {
        CTcTokenizer::next(G_tok);
        break;
      }
      propset_token_source::insert_token(this_00,&G_tok->curtok_);
      CTcTokenizer::next(G_tok);
      bVar10 = bVar3;
    }
  }
  lVar8 = (long)propset_depth;
  while( true ) {
    bVar10 = lVar8 == 0;
    lVar8 = lVar8 + -1;
    if (bVar10) {
      propset_token_source::insert_token(this_00,TOKT_RPAR,")",1);
      CTcTokenizer::set_external_source(G_tok,(CTcTokenSource *)this_00);
      return;
    }
    pppVar5 = &propset_stack[lVar8].param_tok_head;
    do {
      ppVar9 = *pppVar5;
      if (ppVar9 == (propset_tok *)0x0) goto LAB_0023398e;
      pppVar5 = &ppVar9->nxt;
    } while ((ppVar9->tok).typ_ != TOKT_TIMES);
    ppVar9 = *pppVar5;
    if (ppVar9 == (propset_tok *)0x0) break;
    if ((ppVar9->tok).typ_ != TOKT_COMMA) goto LAB_00233991;
    while( true ) {
      ppVar9 = ppVar9->nxt;
LAB_00233991:
      if (ppVar9 == (propset_tok *)0x0) break;
      if (bVar3) {
        propset_token_source::insert_token(this_00,TOKT_COMMA,",",1);
      }
      propset_token_source::insert_token(this_00,&ppVar9->tok);
      bVar3 = false;
    }
  }
LAB_0023398e:
  ppVar9 = (propset_tok *)0x0;
  goto LAB_00233991;
}

Assistant:

void CTcParser::insert_propset_expansion(struct propset_def *propset_stack,
                                         int propset_depth)
{
    /* 
     *   First, determine if we have any added formals from propertyset
     *   definitions.  
     */
    int i;
    int formals_found;
    for (formals_found = FALSE, i = 0 ; i < propset_depth ; ++i)
    {
        /* if this one has formals, so note */
        if (propset_stack[i].param_tok_head != 0)
        {
            /* note it, and we need not look further */
            formals_found = TRUE;
            break;
        }
    }
    
    /*
     *   If we found formals from property sets, we must expand them into the
     *   token stream.  
     */
    if (formals_found)
    {
        /* insert an open paren at the start of the expansion list */
		propset_token_source *tok_src = new (G_prsmem) propset_token_source;
        tok_src->insert_token(TOKT_LPAR, "(", 1);
        
        /* we don't yet need a leading comma */
        int need_comma = FALSE;
        
        /*
         *   Add the tokens from each propertyset in the stack, from the
         *   outside in, until we reach an asterisk in each stack.  
         */
        for (i = 0 ; i < propset_depth ; ++i)
        {
            propset_tok *cur;
            
            /* add the tokens from the stack element */
            for (cur = propset_stack[i].param_tok_head ; cur != 0 ;
                 cur = cur->nxt)
            {
                /*
                 *   If we need a comma before the next real element, add it
                 *   now.  
                 */
                if (need_comma)
                {
                    tok_src->insert_token(TOKT_COMMA, ",", 1);
                    need_comma = FALSE;
                }
                
                /*
                 *   If this is a comma and the next item is the '*', omit
                 *   the comma - if we have nothing more following, we want
                 *   to suppress the comma.  
                 */
                if (cur->tok.gettyp() == TOKT_COMMA
                    && cur->nxt != 0
                    && cur->nxt->tok.gettyp() == TOKT_TIMES)
                {
                    /* 
                     *   it's the comma before the star - simply stop here
                     *   for this list, but note that we need a comma before
                     *   any additional formals that we add in the future 
                     */
                    need_comma = TRUE;
                    break;
                }
                
                /* 
                 *   if it's the '*' for this list, stop here, since we want
                 *   to insert the next level in before we add these tokens 
                 */
                if (cur->tok.gettyp() == TOKT_TIMES)
                    break;
                
                /* insert it into our expansion list */
                tok_src->insert_token(&cur->tok);
            }
        }
        
        /*
         *   If we have explicit formals in the true input stream, add them,
         *   up to but not including the close paren.  
         */
        if (G_tok->cur() == TOKT_LPAR)
        {
            /* skip the open paren */
            G_tok->next();
            
            /* check for a non-empty list */
            if (G_tok->cur() != TOKT_RPAR)
            {
                /* 
                 *   the list is non-empty - if we need a comma, add it now 
                 */
                if (need_comma)
                    tok_src->insert_token(TOKT_COMMA, ",", 1);
                
                /* we will need a comma at the end of this list */
                need_comma = TRUE;
            }
            
            /* 
             *   copy everything up to but not including the close paren to
             *   the expansion list 
             */
            while (G_tok->cur() != TOKT_RPAR
                   && G_tok->cur() != TOKT_EOF)
            {
                /* insert this token into our expansion list */
                tok_src->insert_token(G_tok->getcur());
                
                /* skip it */
                G_tok->next();
            }
            
            /* skip the closing paren */
            if (G_tok->cur() == TOKT_RPAR)
                G_tok->next();
        }
        
        /* 
         *   Finish the expansion by adding the parts of each propertyset
         *   list after the '*' to the expansion list.  Copy from the inside
         *   out, since we want to unwind the nesting from outside in that we
         *   did to start with.  
         */
        for (i = propset_depth ; i != 0 ; )
        {
            /* move down to the next level */
            --i;
            
            /* find the '*' in this list */
            propset_tok *cur;
            for (cur = propset_stack[i].param_tok_head ;
                 cur != 0 && cur->tok.gettyp() != TOKT_TIMES ;
                 cur = cur->nxt) ;
            
            /* if we found the '*', skip it */
            if (cur != 0)
                cur = cur->nxt;
            
            /* 
             *   also skip the comma following the '*', if present - we'll
             *   explicitly insert the needed extra comma if we actually find
             *   we need one 
             */
            if (cur != 0 && cur->tok.gettyp() == TOKT_COMMA)
                cur = cur->nxt;
            
            /* insert the remainder of the list into the expansion list */
            for ( ; cur != 0 ; cur = cur->nxt)
            {
                /* if we need a comma, add it now */
                if (need_comma)
                {
                    tok_src->insert_token(TOKT_COMMA, ",", 1);
                    need_comma = FALSE;
                }
                
                /* insert this token */
                tok_src->insert_token(&cur->tok);
            }
        }
        
        /* add the closing paren at the end of the expansion list */
        tok_src->insert_token(TOKT_RPAR, ")", 1);
        
        /*
         *   We've fully expanded the formal list.  Now all that remains is
         *   to insert the expanded token list into the token input stream,
         *   so that we read from the expanded list instead of from the
         *   original token stream.  
         */
        G_tok->set_external_source(tok_src);
    }
}